

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O3

int QMetaTypeIdQObject<QFlags<QMessageBox::StandardButton>,_16>::qt_metatype_id(void)

{
  __atomic_base<int> _Var1;
  char *__s;
  size_t sVar2;
  QByteArray *pQVar3;
  long lVar4;
  long in_FS_OFFSET;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QByteArray local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  _Var1._M_i = (__int_type)qt_metatype_id::metatype_id._q_value.super___atomic_base<int>._M_i;
  if ((__atomic_base<int>)qt_metatype_id::metatype_id._q_value.super___atomic_base<int>._M_i ==
      (__atomic_base<int>)0x0) {
    __s = (char *)QMetaObject::className();
    local_38.d.size = 0;
    local_38.d.d = (Data *)0x0;
    local_38.d.ptr = (char *)0x0;
    sVar2 = strlen(__s);
    lVar4 = 0;
    if (0 < (long)(sVar2 + 0x11)) {
      lVar4 = sVar2 + 0x11;
    }
    QByteArray::reallocData((longlong)&local_38,(AllocationOption)lVar4);
    if ((&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) &&
       (*(qsizetype *)((long)local_38.d.d + 8) != 0)) {
      *(byte *)&(((ArrayOptions *)((long)local_38.d.d + 4))->
                super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                super_QFlagsStorage<QArrayData::ArrayOption>.i =
           (byte)(((ArrayOptions *)((long)local_38.d.d + 4))->
                 super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                 super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
    }
    pQVar3 = QByteArray::append(&local_38,__s,-1);
    QVar5.m_data = (storage_type *)0x2;
    QVar5.m_size = (pQVar3->d).size;
    lVar4 = QByteArray::insert((longlong)pQVar3,QVar5);
    QVar6.m_data = (storage_type *)0xf;
    QVar6.m_size = *(qsizetype *)(lVar4 + 0x10);
    QByteArray::insert(lVar4,QVar6);
    _Var1._M_i = qRegisterNormalizedMetaTypeImplementation<QFlags<QMessageBox::StandardButton>>
                           (&local_38);
    qt_metatype_id::metatype_id._q_value.super___atomic_base<int>._M_i = (Type)(Type)_Var1._M_i;
    if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,1,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return _Var1._M_i;
  }
  __stack_chk_fail();
}

Assistant:

static int qt_metatype_id()
    {
        Q_CONSTINIT static QBasicAtomicInt metatype_id = Q_BASIC_ATOMIC_INITIALIZER(0);
        if (const int id = metatype_id.loadAcquire())
            return id;
        const char *eName = qt_getEnumName(T());
        const char *cName = qt_getEnumMetaObject(T())->className();
        QByteArray typeName;
        typeName.reserve(strlen(cName) + 2 + strlen(eName));
        typeName.append(cName).append("::").append(eName);
        const int newId = qRegisterNormalizedMetaType<T>(typeName);
        metatype_id.storeRelease(newId);
        return newId;
    }